

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::BasicState2::Run(BasicState2 *this)

{
  GLuint divisor;
  bool bVar1;
  GLuint GVar2;
  CallLogWrapper *this_00;
  byte bVar3;
  VertexBindingState vb;
  VertexAttribState local_180;
  VertexAttribState local_120;
  VertexBindingState local_c0;
  VertexBindingState local_78;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  bVar3 = 1;
  GVar2 = 0;
  do {
    deqp::GLWrapper::GLWrapper(&local_120.super_GLWrapper);
    local_120.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_020f8358;
    local_120.array_enabled = 0;
    local_120.array_size = 4;
    local_120.array_stride = 0;
    local_120.array_type = 0x1406;
    local_120.array_normalized = 0;
    local_120.array_integer = 0;
    local_120.array_divisor = 0;
    local_120.array_pointer = 0;
    local_120._80_8_ = (ulong)GVar2 << 0x20;
    local_120._88_8_ = (ulong)GVar2 << 0x20;
    deqp::GLWrapper::GLWrapper(&local_180.super_GLWrapper);
    local_180.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_020f8390;
    local_180._40_8_ = local_180._40_8_ & 0xffffffff00000000;
    local_180.array_stride = 0;
    local_180.array_type = 0;
    local_180.array_normalized = 0x10;
    local_180.array_integer = 0;
    divisor = GVar2 + 7;
    local_180.array_divisor = GVar2;
    glu::CallLogWrapper::glVertexAttribDivisor(this_00,GVar2,divisor);
    local_180.array_integer = divisor;
    local_120.array_divisor = divisor;
    bVar1 = VertexAttribState::stateVerify(&local_120);
    if (bVar1) {
      bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&local_180);
      if (!bVar1) goto LAB_00c04f19;
    }
    else {
LAB_00c04f19:
      bVar3 = 0;
      anon_unknown_0::Output("glVertexAttribDivisor state change check failed.\n");
    }
    glu::CallLogWrapper::~CallLogWrapper(&local_180.super_GLWrapper.super_CallLogWrapper);
    glu::CallLogWrapper::~CallLogWrapper(&local_120.super_GLWrapper.super_CallLogWrapper);
    GVar2 = GVar2 + 1;
  } while (GVar2 != 0x10);
  GVar2 = 0;
  do {
    deqp::GLWrapper::GLWrapper(&local_120.super_GLWrapper);
    local_120.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_020f8358;
    local_120.array_enabled = 0;
    local_120.array_size = 4;
    local_120.array_stride = 0;
    local_120.array_type = 0x1406;
    local_120.array_normalized = 0;
    local_120.array_integer = 0;
    local_120.array_divisor = 0;
    local_120.array_pointer = 0;
    local_120._80_8_ = (ulong)GVar2 << 0x20;
    local_120._88_8_ = (ulong)GVar2 << 0x20;
    deqp::GLWrapper::GLWrapper(&local_180.super_GLWrapper);
    local_180.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_020f8390;
    local_180._40_8_ = local_180._40_8_ & 0xffffffff00000000;
    local_180.array_stride = 0;
    local_180.array_type = 0;
    local_180.array_normalized = 0x10;
    local_180.array_integer = 0;
    local_180.array_divisor = GVar2;
    glu::CallLogWrapper::glVertexBindingDivisor(this_00,GVar2,GVar2);
    local_180.array_integer = GVar2;
    local_120.array_divisor = GVar2;
    bVar1 = VertexAttribState::stateVerify(&local_120);
    if (bVar1) {
      bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&local_180);
      if (!bVar1) goto LAB_00c05018;
    }
    else {
LAB_00c05018:
      bVar3 = 0;
      anon_unknown_0::Output("glVertexBindingDivisor state change check failed.\n");
    }
    glu::CallLogWrapper::~CallLogWrapper(&local_180.super_GLWrapper.super_CallLogWrapper);
    glu::CallLogWrapper::~CallLogWrapper(&local_120.super_GLWrapper.super_CallLogWrapper);
    GVar2 = GVar2 + 1;
  } while (GVar2 != 0x10);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,5);
  deqp::GLWrapper::GLWrapper(&local_120.super_GLWrapper);
  local_120.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_020f8358;
  local_120.array_enabled = 0;
  local_120.array_size = 4;
  local_120.array_stride = 0;
  local_120.array_type = 0x1406;
  local_120.array_normalized = 0;
  local_120.array_integer = 0;
  local_120.array_pointer = 0;
  local_120.array_buffer_binding = 0;
  local_120.binding = 5;
  local_120.relative_offset = 0;
  local_120.index = 5;
  local_120.array_divisor = 5;
  deqp::GLWrapper::GLWrapper(&local_78.super_GLWrapper);
  local_78.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_020f8390;
  local_78.buffer = 0;
  local_78.offset = 0;
  local_78.stride = 0x10;
  local_78.divisor = 5;
  local_78.index = 5;
  deqp::GLWrapper::GLWrapper(&local_180.super_GLWrapper);
  local_180.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_020f8358;
  local_180.array_enabled = 0;
  local_180.array_size = 4;
  local_180.array_stride = 0;
  local_180.array_type = 0x1406;
  local_180.array_normalized = 0;
  local_180.array_integer = 0;
  local_180.array_pointer = 0;
  local_180.array_buffer_binding = 0;
  local_180.binding = 2;
  local_180.relative_offset = 0;
  local_180.index = 2;
  local_180.array_divisor = 5;
  deqp::GLWrapper::GLWrapper(&local_c0.super_GLWrapper);
  local_c0.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_020f8390;
  local_c0.buffer = 0;
  local_c0.offset = 0;
  local_c0.stride = 0x10;
  local_c0.divisor = 2;
  local_c0.index = 2;
  local_180.binding = 5;
  bVar1 = VertexAttribState::stateVerify(&local_120);
  if (bVar1) {
    bVar1 = VertexBindingState::stateVerify(&local_78);
    if (!bVar1) goto LAB_00c051c2;
    bVar1 = VertexAttribState::stateVerify(&local_180);
    if (!bVar1) goto LAB_00c051c2;
    bVar1 = VertexBindingState::stateVerify(&local_c0);
    if (!bVar1) goto LAB_00c051c2;
  }
  else {
LAB_00c051c2:
    bVar3 = 0;
    anon_unknown_0::Output("glVertexAttribBinding state change check failed.\n");
  }
  glu::CallLogWrapper::glVertexAttribDivisor(this_00,2,0x17);
  local_180.binding = 2;
  local_180.array_divisor = 0x17;
  local_c0.divisor = 0x17;
  bVar1 = VertexAttribState::stateVerify(&local_120);
  if (bVar1) {
    bVar1 = VertexBindingState::stateVerify(&local_78);
    if (bVar1) {
      bVar1 = VertexAttribState::stateVerify(&local_180);
      if (bVar1) {
        bVar1 = VertexBindingState::stateVerify(&local_c0);
        if (bVar1) goto LAB_00c0524d;
      }
    }
  }
  bVar3 = 0;
  anon_unknown_0::Output("glVertexAttribDivisor state change check failed.\n");
LAB_00c0524d:
  glu::CallLogWrapper::~CallLogWrapper(&local_c0.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&local_180.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&local_78.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&local_120.super_GLWrapper.super_CallLogWrapper);
  return -(ulong)(~bVar3 & 1);
}

Assistant:

virtual long Run()
	{
		bool status = true;
		glBindVertexArray(m_vao);

		for (GLuint i = 0; i < 16; ++i)
		{
			VertexAttribState  va(i);
			VertexBindingState vb(i);
			glVertexAttribDivisor(i, i + 7);
			va.array_divisor = i + 7;
			vb.divisor		 = i + 7;
			if (!va.stateVerify() || !vb.stateVerify())
			{
				Output("glVertexAttribDivisor state change check failed.\n");
				status = false;
			}
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			VertexAttribState  va(i);
			VertexBindingState vb(i);
			glVertexBindingDivisor(i, i);
			va.array_divisor = i;
			vb.divisor		 = i;
			if (!va.stateVerify() || !vb.stateVerify())
			{
				Output("glVertexBindingDivisor state change check failed.\n");
				status = false;
			}
		}

		glVertexAttribBinding(2, 5);
		VertexAttribState va5(5);
		va5.array_divisor = 5;
		VertexBindingState vb5(5);
		vb5.divisor = 5;
		VertexAttribState va2(2);
		va2.array_divisor = 5; // binding state seen thru mapping
		VertexBindingState vb2(2);
		vb2.divisor = 2;
		va2.binding = 5;
		if (!va5.stateVerify() || !vb5.stateVerify() || !va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribBinding state change check failed.\n");
			status = false;
		}

		glVertexAttribDivisor(2, 23);
		va2.binding		  = 2; // glVAD defaults mapping
		va2.array_divisor = 23;
		vb2.divisor		  = 23;
		if (!va5.stateVerify() || !vb5.stateVerify() || !va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribDivisor state change check failed.\n");
			status = false;
		}

		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}